

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileForeach(jx9_gen_state *pGen)

{
  jx9_foreach_info *pBlock;
  sxi32 sVar1;
  sxu32 nFirstInstr;
  sxu32 sVar2;
  VmInstr *pVVar3;
  bool bVar4;
  sxi32 nKeywrd;
  sxi32 rc;
  sxu32 nLine;
  VmInstr *pInstr;
  undefined8 *puStack_40;
  sxu32 nFalseJump;
  jx9_foreach_info *pInfo;
  GenBlock *pForeachBlock;
  SyToken *pEnd;
  SyToken *pTmp;
  SyToken *pCur;
  jx9_gen_state *pGen_local;
  
  pForeachBlock = (GenBlock *)0x0;
  pInfo = (jx9_foreach_info *)0x0;
  sVar2 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  pCur = (SyToken *)pGen;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x200) != 0)) {
    pGen->pIn = pGen->pIn + 1;
    nFirstInstr = jx9VmInstrLength(pGen->pVm);
    sVar1 = GenStateEnterBlock(pGen,1,nFirstInstr,(void *)0x0,(GenBlock **)&pInfo);
    if (sVar1 != 0) {
      return -10;
    }
    jx9DelimitNestedTokens
              ((SyToken *)pCur[10].pUserData,(SyToken *)pCur[0xb].sData.zString,0x200,0x400,
               (SyToken **)&pForeachBlock);
    if (((GenBlock *)pCur[10].pUserData == pForeachBlock) ||
       ((GenBlock *)pCur[0xb].sData.zString <= pForeachBlock)) {
      sVar1 = jx9GenCompileError((jx9_gen_state *)pCur,1,sVar2,"foreach: Missing expression");
      if (sVar1 == -10) {
        return -10;
      }
      pCur[10].pUserData = pForeachBlock;
      if (pCur[10].pUserData < pCur[0xb].sData.zString) {
        pCur[10].pUserData = (void *)((long)pCur[10].pUserData + 0x20);
      }
      return 0;
    }
    for (pTmp = (SyToken *)pCur[10].pUserData;
        (pTmp < pForeachBlock && (((pTmp->nType & 4) == 0 || ((int)pTmp->pUserData != 0xb))));
        pTmp = pTmp + 1) {
    }
    if ((SyToken *)pCur[10].pUserData < pTmp) {
      pEnd = (SyToken *)pCur[0xb].sData.zString;
      pCur[0xb].sData.zString = (char *)pTmp;
      sVar1 = jx9CompileExpr((jx9_gen_state *)pCur,0,
                             (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      if (sVar1 == -10) {
        return -10;
      }
      while ((SyToken *)pCur[10].pUserData < pTmp) {
        sVar1 = jx9GenCompileError((jx9_gen_state *)pCur,1,
                                   *(sxu32 *)((long)pCur[10].pUserData + 0x14),
                                   "foreach: Unexpected token \'%z\'",pCur[10].pUserData);
        if (sVar1 == -10) {
          return -10;
        }
        pCur[10].pUserData = (void *)((long)pCur[10].pUserData + 0x20);
      }
      pTmp = pTmp + 1;
      pCur[10].pUserData = pTmp;
      if ((pForeachBlock <= (GenBlock *)pCur[10].pUserData) &&
         (sVar1 = jx9GenCompileError((jx9_gen_state *)pCur,1,
                                     *(sxu32 *)((long)pCur[10].pUserData + 0x14),
                                     "foreach: Missing $key => $value pair"), sVar1 == -10)) {
        return -10;
      }
      puStack_40 = (undefined8 *)SyMemBackendAlloc((SyMemBackend *)(pCur->sData).zString,0x50);
      if (puStack_40 == (undefined8 *)0x0) {
        jx9GenCompileError((jx9_gen_state *)pCur,1,*(sxu32 *)((long)pCur[10].pUserData + 0x14),
                           "Fatal, JX9 engine is running out-of-memory");
        return -10;
      }
      SyZero(puStack_40,0x50);
      SySetInit((SySet *)(puStack_40 + 5),(SyMemBackend *)(pCur->sData).zString,8);
      while( true ) {
        bVar4 = false;
        if (pTmp < pForeachBlock) {
          bVar4 = (pTmp->nType & 0x20000) == 0;
        }
        if (!bVar4) break;
        pTmp = pTmp + 1;
      }
      if (pTmp < pForeachBlock) {
        if ((SyToken *)pCur[10].pUserData < pTmp) {
          pCur[0xb].sData.zString = (char *)pTmp;
          sVar1 = jx9CompileExpr((jx9_gen_state *)pCur,0,GenStateForEachNodeValidator);
          if (sVar1 == -10) {
            return -10;
          }
          pVVar3 = jx9VmPopInstr((jx9_vm *)(pCur->sData).zString);
          if (pVVar3->p3 != (void *)0x0) {
            *puStack_40 = pVVar3->p3;
            sVar2 = SyStrlen((char *)pVVar3->p3);
            *(sxu32 *)(puStack_40 + 1) = sVar2;
          }
          *(uint *)(puStack_40 + 4) = *(uint *)(puStack_40 + 4) | 1;
        }
        else {
          sVar1 = jx9GenCompileError((jx9_gen_state *)pCur,1,
                                     *(sxu32 *)((long)pCur[10].pUserData + 0x14),
                                     "foreach: Missing $key");
          if (sVar1 == -10) {
            return -10;
          }
        }
        pCur[10].pUserData = pTmp + 1;
      }
      pCur[0xb].sData.zString = (char *)pForeachBlock;
      if ((GenBlock *)pCur[10].pUserData < pForeachBlock) {
        sVar1 = jx9CompileExpr((jx9_gen_state *)pCur,0,GenStateForEachNodeValidator);
        if (sVar1 == -10) {
          return -10;
        }
        pVVar3 = jx9VmPopInstr((jx9_vm *)(pCur->sData).zString);
        if (pVVar3->p3 != (void *)0x0) {
          puStack_40[2] = pVVar3->p3;
          sVar2 = SyStrlen((char *)pVVar3->p3);
          *(sxu32 *)(puStack_40 + 3) = sVar2;
        }
        jx9VmEmitInstr((jx9_vm *)(pCur->sData).zString,0x43,0,0,puStack_40,
                       (sxu32 *)((long)&pInstr + 4));
        GenStateNewJumpFixup((GenBlock *)pInfo,0x43,pInstr._4_4_);
        sVar2 = jx9VmInstrLength((jx9_vm *)(pCur->sData).zString);
        *(sxu32 *)&(pInfo->sValue).zString = sVar2;
        jx9VmEmitInstr((jx9_vm *)(pCur->sData).zString,0x44,0,0,puStack_40,
                       (sxu32 *)((long)&pInstr + 4));
        GenStateNewJumpFixup((GenBlock *)pInfo,0x44,pInstr._4_4_);
        pCur[10].pUserData = &(pForeachBlock->aJumpFix).pBase;
        pCur[0xb].sData.zString = (char *)pEnd;
        sVar1 = jx9CompileBlock((jx9_gen_state *)pCur);
        if (sVar1 == -10) {
          return -10;
        }
        jx9VmEmitInstr((jx9_vm *)(pCur->sData).zString,8,0,*(sxu32 *)&(pInfo->sValue).zString,
                       (void *)0x0,(sxu32 *)0x0);
        pBlock = pInfo;
        sVar2 = jx9VmInstrLength((jx9_vm *)(pCur->sData).zString);
        GenStateFixJumps((GenBlock *)pBlock,-1,sVar2);
        GenStateLeaveBlock((jx9_gen_state *)pCur,(GenBlock **)0x0);
        return 0;
      }
      sVar1 = jx9GenCompileError((jx9_gen_state *)pCur,1,*(sxu32 *)((long)pCur[10].pUserData + 0x14)
                                 ,"foreach: Missing $value");
      if (sVar1 == -10) {
        return -10;
      }
    }
    else {
      sVar1 = jx9GenCompileError((jx9_gen_state *)pCur,1,*(sxu32 *)((long)pCur[10].pUserData + 0x14)
                                 ,"foreach: Missing array/object expression");
      if (sVar1 == -10) {
        return -10;
      }
    }
  }
  else {
    sVar1 = jx9GenCompileError(pGen,1,sVar2,"foreach: Expected \'(\'");
    if (sVar1 == -10) {
      return -10;
    }
  }
  while( true ) {
    bVar4 = false;
    if (pCur[10].pUserData < pCur[0xb].sData.zString) {
      bVar4 = (*(uint *)((long)pCur[10].pUserData + 0x10) & 0x40040) == 0;
    }
    if (!bVar4) break;
    pCur[10].pUserData = (void *)((long)pCur[10].pUserData + 0x20);
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileForeach(jx9_gen_state *pGen)
{ 
	SyToken *pCur, *pTmp, *pEnd = 0;
	GenBlock *pForeachBlock = 0;
	jx9_foreach_info *pInfo;
	sxu32 nFalseJump;
	VmInstr *pInstr;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'foreach' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "foreach: Expected '('");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pForeachBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the expression */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "foreach: Missing expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Synchronize */
		pGen->pIn = pEnd;
		if( pGen->pIn < pGen->pEnd ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Compile the array expression */
	pCur = pGen->pIn;
	while( pCur < pEnd ){
		if( pCur->nType & JX9_TK_KEYWORD ){
			sxi32 nKeywrd = SX_PTR_TO_INT(pCur->pUserData);
			if( nKeywrd == JX9_TKWRD_AS ){
				/* Break with the first 'as' found */
				break;
			}
		}
		/* Advance the stream cursor */
		pCur++;
	}
	if( pCur <= pGen->pIn ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, 
			"foreach: Missing array/object expression");
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pCur;
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pCur ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pCur++; /* Jump the 'as' keyword */
	pGen->pIn = pCur; 
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $key => $value pair");
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	/* Create the foreach context */
	pInfo = (jx9_foreach_info *)SyMemBackendAlloc(&pGen->pVm->sAllocator, sizeof(jx9_foreach_info));
	if( pInfo == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Fatal, JX9 engine is running out-of-memory");
		return SXERR_ABORT;
	}
	/* Zero the structure */
	SyZero(pInfo, sizeof(jx9_foreach_info));
	/* Initialize structure fields */
	SySetInit(&pInfo->aStep, &pGen->pVm->sAllocator, sizeof(jx9_foreach_step *));
	/* Check if we have a key field */
	while( pCur < pEnd && (pCur->nType & JX9_TK_COMMA) == 0 ){
		pCur++;
	}
	if( pCur < pEnd ){
		/* Compile the expression holding the key name */
		if( pGen->pIn >= pCur ){
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $key");
			if( rc == SXERR_ABORT ){
				/* Don't worry about freeing memory, everything will be released shortly */
				return SXERR_ABORT;
			}
		}else{
			pGen->pEnd = pCur;
			rc = jx9CompileExpr(&(*pGen), 0, GenStateForEachNodeValidator);
			if( rc == SXERR_ABORT ){
				/* Don't worry about freeing memory, everything will be released shortly */
				return SXERR_ABORT;
			}
			pInstr = jx9VmPopInstr(pGen->pVm);
			if( pInstr->p3 ){
				/* Record key name */
				SyStringInitFromBuf(&pInfo->sKey, pInstr->p3, SyStrlen((const char *)pInstr->p3));
			}
			pInfo->iFlags |= JX9_4EACH_STEP_KEY;
		}
		pGen->pIn = &pCur[1]; /* Jump the arrow */
	}
	pGen->pEnd = pEnd;
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $value");
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Compile the expression holding the value name */
	rc = jx9CompileExpr(&(*pGen), 0, GenStateForEachNodeValidator);
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	pInstr = jx9VmPopInstr(pGen->pVm);
	if( pInstr->p3 ){
		/* Record value name */
		SyStringInitFromBuf(&pInfo->sValue, pInstr->p3, SyStrlen((const char *)pInstr->p3));
	}
	/* Emit the 'FOREACH_INIT' instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_FOREACH_INIT, 0, 0, pInfo, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pForeachBlock, JX9_OP_FOREACH_INIT, nFalseJump);
	/* Record the first instruction to execute */
	pForeachBlock->nFirstInstr = jx9VmInstrLength(pGen->pVm);
	/* Emit the FOREACH_STEP instruction */
    jx9VmEmitInstr(pGen->pVm, JX9_OP_FOREACH_STEP, 0, 0, pInfo, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pForeachBlock, JX9_OP_FOREACH_STEP, nFalseJump);
	/* Compile the loop body */
	pGen->pIn = &pEnd[1];
	pGen->pEnd = pTmp;
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pForeachBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pForeachBlock, -1,jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid 
	 * compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}